

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

bool P_IsVisible(AActor *lookee,AActor *other,INTBOOL allaround,FLookExParams *params)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  double local_40;
  double local_38;
  double local_30;
  _func_int **local_28;
  
  if (other != (AActor *)0x0) {
    if (params == (FLookExParams *)0x0) {
      if (allaround == 0) {
        uVar3 = 0x40668000;
      }
      else {
        uVar3 = 0;
      }
      local_40 = (double)((ulong)uVar3 << 0x20);
      local_30 = 0.0;
      local_38 = 0.0;
    }
    else {
      local_38 = params->maxDist;
      local_40 = (params->Fov).Degrees;
      local_30 = params->minDist;
    }
    dVar1 = AActor::Distance2D(lookee,other,false);
    if (((local_38 != 0.0) || (NAN(local_38))) && (local_38 < dVar1)) {
      return false;
    }
    if ((((local_30 == 0.0) && (!NAN(local_30))) || (local_30 <= dVar1)) &&
       (((local_40 == 0.0 && (!NAN(local_40))) ||
        ((AActor::AngleTo((AActor *)&stack0xffffffffffffffd8,lookee,SUB81(other,0)),
         ABS((double)SUB84(((double)local_28 - (lookee->Angles).Yaw.Degrees) * 11930464.711111112 +
                           6755399441055744.0,0) * 8.381903171539307e-08) <= local_40 * 0.5 ||
         (((local_30 == 0.0 && (!NAN(local_30))) && (dVar1 <= lookee->meleerange + lookee->radius)))
         ))))) {
      bVar2 = P_CheckSight(lookee,other,2);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool P_IsVisible(AActor *lookee, AActor *other, INTBOOL allaround, FLookExParams *params)
{
	double maxdist;
	double mindist;
	DAngle fov;

	if (other == nullptr)
	{
		return false;
	}

	if (params != NULL)
	{
		maxdist = params->maxDist;
		mindist = params->minDist;
		fov = params->Fov;
	}
	else
	{
		mindist = maxdist = 0;
		fov = allaround ? 0. : 180.;
	}

	double dist = lookee->Distance2D (other);

	if (maxdist && dist > maxdist)
		return false;			// [KS] too far

	if (mindist && dist < mindist)
		return false;			// [KS] too close

	if (fov != 0)
	{
		DAngle an = absangle(lookee->AngleTo(other), lookee->Angles.Yaw);

		if (an > (fov / 2))
		{
			// if real close, react anyway
			// [KS] but respect minimum distance rules
			if (mindist || dist > lookee->meleerange + lookee->radius)
				return false;	// outside of fov
		}
	}

	// P_CheckSight is by far the most expensive operation in here so let's do it last.
	return P_CheckSight(lookee, other, SF_SEEPASTSHOOTABLELINES);
}